

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

bool llvm::itaniumFindTypesInMangledName
               (char *MangledName,void *Ctx,_func_void_void_ptr_char_ptr *Callback)

{
  size_t sVar1;
  Node *pNVar2;
  undefined1 local_1328 [760];
  char acStack_1030 [4088];
  BlockMeta *local_38;
  
  sVar1 = strlen(MangledName);
  local_1328._8_8_ = MangledName + sVar1;
  local_1328._16_8_ = local_1328 + 0x28;
  local_1328._32_8_ = local_1328 + 0x128;
  local_1328._296_8_ = local_1328 + 0x140;
  local_1328._312_8_ = local_1328 + 0x240;
  local_1328._576_8_ = local_1328 + 600;
  local_1328._592_8_ = local_1328 + 0x298;
  local_1328._664_8_ = local_1328 + 0x2b0;
  local_1328._680_8_ = local_1328 + 0x2d0;
  local_1328[0x2e0] = true;
  local_1328[0x2e1] = false;
  local_1328[0x2e2] = false;
  local_38 = (BlockMeta *)(local_1328 + 0x2f0);
  local_1328[0x2f0] = '\0';
  local_1328[0x2f1] = '\0';
  local_1328[0x2f2] = '\0';
  local_1328[0x2f3] = '\0';
  local_1328[0x2f4] = '\0';
  local_1328[0x2f5] = '\0';
  local_1328[0x2f6] = '\0';
  local_1328[0x2f7] = '\0';
  acStack_1030[0] = '\0';
  acStack_1030[1] = '\0';
  acStack_1030[2] = '\0';
  acStack_1030[3] = '\0';
  acStack_1030[4] = '\0';
  acStack_1030[5] = '\0';
  acStack_1030[6] = '\0';
  acStack_1030[7] = '\0';
  local_1328._0_8_ = MangledName;
  local_1328._24_8_ = local_1328._16_8_;
  local_1328._304_8_ = local_1328._296_8_;
  local_1328._584_8_ = local_1328._576_8_;
  local_1328._672_8_ = local_1328._664_8_;
  local_1328._720_8_ = Callback;
  local_1328._728_8_ = Ctx;
  pNVar2 = anon_unknown.dwarf_4afdb9::Db::parse((Db *)local_1328);
  anon_unknown.dwarf_4afdb9::Db::~Db((Db *)local_1328);
  return pNVar2 == (Node *)0x0;
}

Assistant:

bool llvm::itaniumFindTypesInMangledName(const char *MangledName, void *Ctx,
                                         void (*Callback)(void *,
                                                          const char *)) {
  Db Parser(MangledName, MangledName + std::strlen(MangledName));
  Parser.TypeCallback = Callback;
  Parser.TypeCallbackContext = Ctx;
  return Parser.parse() == nullptr;
}